

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O2

void __thiscall board::Board::generateHash(Board *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  Board *pBVar5;
  
  uVar2 = 0;
  pBVar5 = this;
  for (lVar4 = 0; lVar4 != 0x3c0; lVar4 = lVar4 + 8) {
    iVar1 = pBVar5->board[0];
    if (((long)iVar1 != 0) && (iVar1 != 99)) {
      uVar2 = uVar2 ^ *(ulong *)((long)PIECE_KEYS[iVar1] + lVar4);
    }
    pBVar5 = (Board *)(pBVar5->board + 1);
  }
  if ((long)this->enPas != 99) {
    uVar2 = uVar2 ^ PIECE_KEYS[0][this->enPas];
  }
  uVar3 = SIDE_KEY;
  if (this->side != 0) {
    uVar3 = 0;
  }
  this->hashKey = uVar3 ^ uVar2;
  return;
}

Assistant:

void board::Board::generateHash()
{
    uint64_t key = 0;
    int piece;
    for (int square = 0; square < 120; square++) {
        piece = board[square];
        if (piece != NO_SQ && piece != EMPTY) {
            key ^= PIECE_KEYS[piece][square];
        }
    }
    if (enPas != NO_SQ) {
        key ^= PIECE_KEYS[EMPTY][enPas];
    }
    if (side == WHITE) {
        key ^= SIDE_KEY;
    }
    hashKey = key;
}